

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall SuiteMessageTests::TestgetFieldIfPresent::RunImpl(TestgetFieldIfPresent *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_3c8 [2];
  TestDetails local_388;
  undefined1 local_368 [8];
  MsgType stored;
  TestDetails local_2e8;
  allocator<char> local_2c1;
  STRING local_2c0;
  StringField local_2a0;
  TestDetails local_220;
  allocator<char> local_1e9;
  STRING local_1e8;
  undefined1 local_1c8 [8];
  MsgType initial;
  Message message;
  TestgetFieldIfPresent *this_local;
  
  FIX::Message::Message((Message *)&initial.super_StringField.super_FieldBase.m_metrics.m_checksum);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"A",&local_1e9);
  FIX::MsgType::MsgType((MsgType *)local_1c8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  bVar2 = FIX::FieldMap::getFieldIfSet
                    ((FieldMap *)&initial.super_StringField.super_FieldBase.m_metrics.m_checksum,
                     (FieldBase *)local_1c8);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_220,*ppTVar4,0x78);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_220,"!message.getFieldIfSet( initial )");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"A",&local_2c1);
  FIX::MsgType::MsgType((MsgType *)&local_2a0,&local_2c0);
  bVar2 = FIX::StringField::operator==((StringField *)local_1c8,&local_2a0);
  bVar2 = UnitTest::Check<bool>(bVar2);
  FIX::MsgType::~MsgType((MsgType *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_2e8,*ppTVar4,0x79);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_2e8,"initial == FIX::MsgType(\"A\")");
  }
  FIX::FieldMap::setField
            ((FieldMap *)&initial.super_StringField.super_FieldBase.m_metrics.m_checksum,
             (FieldBase *)local_1c8,true);
  FIX::MsgType::MsgType((MsgType *)local_368);
  bVar2 = FIX::FieldMap::getFieldIfSet
                    ((FieldMap *)&initial.super_StringField.super_FieldBase.m_metrics.m_checksum,
                     (FieldBase *)local_368);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_388,*ppTVar4,0x7d);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_388,"message.getFieldIfSet( stored )");
  }
  bVar2 = FIX::StringField::operator==((StringField *)local_368,(StringField *)local_1c8);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_3c8,*ppTVar4,0x7e);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_3c8,"stored == initial");
  }
  FIX::MsgType::~MsgType((MsgType *)local_368);
  FIX::MsgType::~MsgType((MsgType *)local_1c8);
  FIX::Message::~Message((Message *)&initial.super_StringField.super_FieldBase.m_metrics.m_checksum)
  ;
  return;
}

Assistant:

TEST(getFieldIfPresent)
{
  FIX::Message message;
  FIX::MsgType initial("A");
  CHECK( !message.getFieldIfSet( initial ) );
  CHECK( initial == FIX::MsgType("A") );

  message.setField( initial );
  FIX::MsgType stored;
  CHECK( message.getFieldIfSet( stored ) );
  CHECK( stored == initial );
}